

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O2

void Assimp::IFC::ProcessBooleanExtrudedAreaSolidDifference
               (IfcExtrudedAreaSolid *as,TempMesh *result,TempMesh *first_operand,
               ConversionData *conv)

{
  pointer puVar1;
  IfcVector3 extrusionDir;
  TempMesh *__p;
  pointer puVar2;
  __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  __first;
  uint pcount;
  allocator_type local_169;
  TempMesh *local_168;
  shared_ptr<Assimp::IFC::TempMesh> meshtmp;
  IfcVector3 local_150;
  shared_ptr<Assimp::IFC::TempMesh> local_138;
  __shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2> local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  double local_108;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings;
  IfcVector3 local_d8;
  value_type local_c0;
  TempMesh temp;
  _Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_48;
  
  local_168 = result;
  if (as != (IfcExtrudedAreaSolid *)0x0) {
    __p = (TempMesh *)operator_new(0x30);
    (__p->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__shared_ptr<Assimp::IFC::TempMesh,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Assimp::IFC::TempMesh,void>
              ((__shared_ptr<Assimp::IFC::TempMesh,(__gnu_cxx::_Lock_policy)2> *)&meshtmp,__p);
    ProcessExtrudedAreaSolid
              (as,meshtmp.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,conv,false);
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0.0;
    std::__shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_128,
               &meshtmp.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>);
    local_138.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_138.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    extrusionDir.y = (double)uStack_110;
    extrusionDir.x = (double)local_118;
    extrusionDir.z = local_108;
    TempOpening::TempOpening
              ((TempOpening *)&temp,(IfcSolidModel *)as,extrusionDir,
               (shared_ptr<Assimp::IFC::TempMesh> *)&local_128,&local_138);
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::vector
              (&openings,1,(TempOpening *)&temp,(allocator_type *)&local_150);
    TempOpening::~TempOpening((TempOpening *)&temp);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_138.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
    TempMesh::operator=(local_168,first_operand);
    temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    temp.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    temp.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    temp.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    __first._M_current =
         (first_operand->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    puVar1 = (first_operand->mVertcnt).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar2 = (first_operand->mVertcnt).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
      pcount = *puVar2;
      TempMesh::Clear(&temp);
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      insert<__gnu_cxx::__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,void>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&temp,
                 (const_iterator)
                 temp.mVerts.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,__first,__first._M_current + pcount);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&temp.mVertcnt,&pcount);
      TempMesh::ComputeLastPolygonNormal(&local_150,&temp,false);
      if (1e-05 <= local_150.z * local_150.z + local_150.x * local_150.x + local_150.y * local_150.y
         ) {
        local_c0.x = 1.0;
        local_c0.y = 0.0;
        local_c0.z = 0.0;
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&local_48,1,
                   &local_c0,&local_169);
        local_d8.x = 0.0;
        local_d8.y = 1.0;
        local_d8.z = 0.0;
        GenerateOpenings(&openings,
                         (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                         &local_48,&temp,false,true,&local_d8);
        std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~_Vector_base
                  (&local_48);
        TempMesh::Append(local_168,&temp);
        __first._M_current = __first._M_current + pcount;
      }
      else {
        LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4dc871);
      }
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4dc921);
    TempMesh::~TempMesh(&temp);
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::~vector
              (&openings);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&meshtmp.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  __assert_fail("as != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCBoolean.cpp"
                ,0x2d3,
                "void Assimp::IFC::ProcessBooleanExtrudedAreaSolidDifference(const Schema_2x3::IfcExtrudedAreaSolid *, TempMesh &, const TempMesh &, ConversionData &)"
               );
}

Assistant:

void ProcessBooleanExtrudedAreaSolidDifference(const Schema_2x3::IfcExtrudedAreaSolid* as, TempMesh& result,
                                               const TempMesh& first_operand,
                                               ConversionData& conv)
{
    ai_assert(as != NULL);

    // This case is handled by reduction to an instance of the quadrify() algorithm.
    // Obviously, this won't work for arbitrarily complex cases. In fact, the first
    // operand should be near-planar. Luckily, this is usually the case in Ifc
    // buildings.

    std::shared_ptr<TempMesh> meshtmp = std::shared_ptr<TempMesh>(new TempMesh());
    ProcessExtrudedAreaSolid(*as,*meshtmp,conv,false);

    std::vector<TempOpening> openings(1, TempOpening(as,IfcVector3(0,0,0),meshtmp,std::shared_ptr<TempMesh>()));

    result = first_operand;

    TempMesh temp;

    std::vector<IfcVector3>::const_iterator vit = first_operand.mVerts.begin();
    for(unsigned int pcount : first_operand.mVertcnt) {
        temp.Clear();

        temp.mVerts.insert(temp.mVerts.end(), vit, vit + pcount);
        temp.mVertcnt.push_back(pcount);

        // The algorithms used to generate mesh geometry sometimes
        // spit out lines or other degenerates which must be
        // filtered to avoid running into assertions later on.

        // ComputePolygonNormal returns the Newell normal, so the
        // length of the normal is the area of the polygon.
        const IfcVector3& normal = temp.ComputeLastPolygonNormal(false);
        if (normal.SquareLength() < static_cast<IfcFloat>(1e-5)) {
            IFCImporter::LogWarn("skipping degenerate polygon (ProcessBooleanExtrudedAreaSolidDifference)");
            continue;
        }

        GenerateOpenings(openings, std::vector<IfcVector3>(1,IfcVector3(1,0,0)), temp, false, true);
        result.Append(temp);

        vit += pcount;
    }

    IFCImporter::LogDebug("generating CSG geometry by geometric difference to a solid (IfcExtrudedAreaSolid)");
}